

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O2

float __thiscall Assimp::BVHLoader::GetNextTokenAsFloat(BVHLoader *this)

{
  float fVar1;
  char *pcVar2;
  float result;
  string token;
  string local_1a8;
  string local_188 [11];
  
  GetNextToken_abi_cxx11_(&token,this);
  if (token._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_188,"Unexpected end of file while trying to read a float",
               (allocator<char> *)&local_1a8);
    ThrowException(this,local_188);
  }
  result = 0.0;
  pcVar2 = fast_atoreal_move<float>(token._M_dataplus._M_p,&result,true);
  fVar1 = result;
  if (pcVar2 == token._M_dataplus._M_p + token._M_string_length) {
    std::__cxx11::string::~string((string *)&token);
    return fVar1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::operator<<((ostream *)local_188,"Expected a floating point number, but found \"");
  std::operator<<((ostream *)local_188,(string *)&token);
  std::operator<<((ostream *)local_188,"\".");
  std::__cxx11::stringbuf::str();
  ThrowException(this,&local_1a8);
}

Assistant:

float BVHLoader::GetNextTokenAsFloat()
{
    std::string token = GetNextToken();
    if( token.empty())
        ThrowException( "Unexpected end of file while trying to read a float");

    // check if the float is valid by testing if the atof() function consumed every char of the token
    const char* ctoken = token.c_str();
    float result = 0.0f;
    ctoken = fast_atoreal_move<float>( ctoken, result);

    if( ctoken != token.c_str() + token.length())
        ThrowException( format() << "Expected a floating point number, but found \"" << token << "\"." );

    return result;
}